

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# priority_list.cpp
# Opt level: O0

void __thiscall Am_Priority_List::Print(Am_Priority_List *this,ostream *os)

{
  ostream *poVar1;
  undefined1 local_30 [8];
  Am_Value v;
  Am_Priority_List_Item *current;
  ostream *os_local;
  Am_Priority_List *this_local;
  
  poVar1 = std::operator<<(os,"PRIORITY_LIST(");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(uint)this->number);
  std::operator<<(poVar1,") [");
  Am_Value::Am_Value((Am_Value *)local_30);
  for (v.value = (anon_union_8_8_ea4c8939_for_value)this->head; v.value != this->tail;
      v.value = *(anon_union_8_8_ea4c8939_for_value *)(v.value.proc_value + 0x18)) {
    print_current(os,(Am_Priority_List_Item *)v.value.wrapper_value);
  }
  if (v.value.wrapper_value != (Am_Wrapper *)0x0) {
    print_current(os,(Am_Priority_List_Item *)v.value.wrapper_value);
  }
  std::operator<<(os,"]");
  Am_Value::~Am_Value((Am_Value *)local_30);
  return;
}

Assistant:

void
Am_Priority_List::Print(std::ostream &os) const
{
  Am_Priority_List_Item *current;
  os << "PRIORITY_LIST(" << (int)number << ") [";
  Am_Value v;
  for (current = head; current != tail; current = current->next) {
    print_current(os, current);
  }
  if (current) {
    print_current(os, current);
  }
  os << "]";
}